

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku_chain.cpp
# Opt level: O2

void __thiscall
SudokuChain::outputSpecification
          (SudokuChain *this,
          vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
          *specifications)

{
  pointer psVar1;
  ostream *poVar2;
  element_type *peVar3;
  int iVar4;
  shared_ptr<SudokuChain::SudokuSpecification> *spec;
  pointer psVar5;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"sudoku specification: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  psVar1 = (specifications->
           super__Vector_base<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  iVar4 = 0;
  for (psVar5 = (specifications->
                super__Vector_base<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
                )._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"  ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((psVar5->
                                super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->squared_size);
    poVar2 = std::operator<<(poVar2,"x");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((psVar5->
                                super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->squared_size);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    (Sudoku::types_abi_cxx11_ +
                                    (int)((psVar5->
                                          super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->type));
    poVar2 = std::operator<<(poVar2,", offset: (");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((psVar5->
                                super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->offset_from_previous_x);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((psVar5->
                                super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->offset_from_previous_y);
    poVar2 = std::operator<<(poVar2,") ");
    poVar2 = std::operator<<(poVar2,"starting index: ");
    std::ostream::operator<<
              (poVar2,((psVar5->
                       super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->firstOwnIndex);
    peVar3 = (psVar5->
             super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if ((peVar3->previous).
        super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::operator<<((ostream *)&std::cout," (previous set)");
      peVar3 = (psVar5->
               super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
    }
    if ((peVar3->next).
        super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::operator<<((ostream *)&std::cout," (next set)");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void SudokuChain::outputSpecification(std::vector<std::shared_ptr<SudokuChain::SudokuSpecification>> specifications)
{
  std::cout<<"sudoku specification: "<<std::endl;
  int i=0;
  for(auto &spec : specifications)
  {
    std::cout<<"  "<<i<<" "<<spec->squared_size<<"x"<<spec->squared_size
      <<" "<<Sudoku::types[int(spec->type)]
      <<", offset: ("<<spec->offset_from_previous_x<<","<<spec->offset_from_previous_y<<") "
      <<"starting index: "<<spec->firstOwnIndex;
    if(spec->previous)
    {
      std::cout<<" (previous set)";
    }
    if(spec->next)
    {
      std::cout<<" (next set)";
    }
    std::cout<<std::endl;
    i++;
  }
}